

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O3

RowVersionManager * __thiscall duckdb::RowGroup::GetOrCreateVersionInfo(RowGroup *this)

{
  optional_ptr<duckdb::RowVersionManager,_true> oVar1;
  optional_ptr<duckdb::RowVersionManager,_true> vinfo;
  optional_ptr<duckdb::RowVersionManager,_true> local_28;
  __atomic_base<unsigned_long> local_18;
  
  local_28 = GetVersionInfo(this);
  if (local_28.ptr == (RowVersionManager *)0x0) {
    GetOrCreateVersionInfoInternal((RowGroup *)&stack0xffffffffffffffe0);
    oVar1.ptr = shared_ptr<duckdb::RowVersionManager,_true>::operator*
                          ((shared_ptr<duckdb::RowVersionManager,_true> *)&stack0xffffffffffffffe0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18._M_i !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18._M_i);
    }
  }
  else {
    optional_ptr<duckdb::RowVersionManager,_true>::CheckValid(&local_28);
    oVar1.ptr = local_28.ptr;
  }
  return oVar1.ptr;
}

Assistant:

RowVersionManager &RowGroup::GetOrCreateVersionInfo() {
	auto vinfo = GetVersionInfo();
	if (vinfo) {
		// version info exists - return it directly
		return *vinfo;
	}
	return *GetOrCreateVersionInfoInternal();
}